

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline_listener.c
# Opt level: O2

HT_TimelineListenerContainer * ht_find_or_create_listener(char *name)

{
  HT_ErrorCode HVar1;
  HT_Mutex *pHVar2;
  HT_TimelineListenerContainer *pHVar3;
  
  if (name != (char *)0x0) {
    pHVar3 = ht_registry_find_listener_container(name);
    if (pHVar3 == (HT_TimelineListenerContainer *)0x0) {
      pHVar3 = ht_timeline_listener_container_create();
      if (pHVar3 == (HT_TimelineListenerContainer *)0x0) {
        pHVar3 = (HT_TimelineListenerContainer *)0x0;
      }
      else {
        ht_registry_register_listener_container(name,pHVar3);
      }
    }
    else {
      pHVar3->refcount = pHVar3->refcount + 1;
    }
    return pHVar3;
  }
  pHVar3 = (HT_TimelineListenerContainer *)ht_alloc(0x30);
  if (pHVar3 != (HT_TimelineListenerContainer *)0x0) {
    HVar1 = ht_bag_listener_init((HT_BagListener *)pHVar3,0x10);
    if (HVar1 == HT_ERR_OK) {
      pHVar2 = ht_mutex_create();
      pHVar3->mutex = pHVar2;
      if (pHVar2 != (HT_Mutex *)0x0) {
        pHVar3->id = 0;
        pHVar3->refcount = 1;
        return pHVar3;
      }
      ht_bag_listener_deinit((HT_BagListener *)pHVar3);
    }
    ht_free(pHVar3);
  }
  return (HT_TimelineListenerContainer *)0x0;
}

Assistant:

HT_TimelineListenerContainer*
ht_find_or_create_listener(const char* name)
{
    HT_TimelineListenerContainer* container;

    if (name == NULL)
    {
        container = ht_timeline_listener_container_create();
    }
    else
    {
        container = ht_registry_find_listener_container(name);
        if (container == NULL)
        {
            container = ht_timeline_listener_container_create();
            if (container != NULL)
            {
                ht_registry_register_listener_container(name, container);
            }
        }
        else
        {
            container->refcount++;
        }
    }

    return container;
}